

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void do_room_or_subroom(level *lev,mkroom *croom,int lowx,int lowy,int hix,int hiy,boolean lit,
                       schar rtype,boolean special,boolean is_room)

{
  int local_44;
  rm *local_38;
  rm *loc;
  int y;
  int x;
  int hiy_local;
  int hix_local;
  int lowy_local;
  int lowx_local;
  mkroom *croom_local;
  level *lev_local;
  
  hix_local = lowx;
  if (lowx == 0) {
    hix_local = 1;
  }
  hiy_local = lowy;
  if (lowy == 0) {
    hiy_local = 1;
  }
  x = hix;
  if (0x4e < hix) {
    x = 0x4e;
  }
  y = hiy;
  if (0x13 < hiy) {
    y = 0x13;
  }
  if (lit == '\0') {
    croom->rlit = '\0';
  }
  else {
    for (loc._4_4_ = hix_local + -1; loc._4_4_ <= x + 1; loc._4_4_ = loc._4_4_ + 1) {
      if (hiy_local + -1 < 1) {
        local_44 = 0;
      }
      else {
        local_44 = hiy_local + -1;
      }
      local_38 = lev->locations[loc._4_4_] + local_44;
      for (loc._0_4_ = hiy_local + -1; (int)loc <= y + 1; loc._0_4_ = (int)loc + 1) {
        *(uint *)&local_38->field_0x6 = *(uint *)&local_38->field_0x6 & 0xfffffbff | 0x400;
        local_38 = local_38 + 1;
      }
    }
    croom->rlit = '\x01';
  }
  croom->lx = (schar)hix_local;
  croom->hx = (schar)x;
  croom->ly = (schar)hiy_local;
  croom->hy = (schar)y;
  croom->rtype = rtype;
  croom->doorct = '\0';
  croom->fdoor = (schar)lev->doorindex;
  croom->irregular = '\0';
  croom->nsubrooms = '\0';
  croom->sbrooms[0] = (mkroom *)0x0;
  if (special == '\0') {
    for (loc._4_4_ = hix_local + -1; loc._4_4_ <= x + 1; loc._4_4_ = loc._4_4_ + 1) {
      for (loc._0_4_ = hiy_local + -1; (int)loc <= y + 1; loc._0_4_ = (y - hiy_local) + 2 + (int)loc
          ) {
        lev->locations[loc._4_4_][(int)loc].typ = '\x02';
        *(uint *)&lev->locations[loc._4_4_][(int)loc].field_0x6 =
             *(uint *)&lev->locations[loc._4_4_][(int)loc].field_0x6 & 0xfffffdff | 0x200;
      }
    }
    for (loc._4_4_ = hix_local + -1; loc._4_4_ <= x + 1; loc._4_4_ = (x - hix_local) + 2 + loc._4_4_
        ) {
      for (loc._0_4_ = hiy_local; (int)loc <= y; loc._0_4_ = (int)loc + 1) {
        lev->locations[loc._4_4_][(int)loc].typ = '\x01';
        *(uint *)&lev->locations[loc._4_4_][(int)loc].field_0x6 =
             *(uint *)&lev->locations[loc._4_4_][(int)loc].field_0x6 & 0xfffffdff;
      }
    }
    for (loc._4_4_ = hix_local; loc._4_4_ <= x; loc._4_4_ = loc._4_4_ + 1) {
      local_38 = lev->locations[loc._4_4_] + hiy_local;
      for (loc._0_4_ = hiy_local; (int)loc <= y; loc._0_4_ = (int)loc + 1) {
        local_38->typ = '\x19';
        local_38 = local_38 + 1;
      }
    }
    if (is_room == '\0') {
      wallification(lev,hix_local,hiy_local,x,y);
    }
    else {
      lev->locations[hix_local + -1][hiy_local + -1].typ = '\x03';
      lev->locations[x + 1][hiy_local + -1].typ = '\x04';
      lev->locations[hix_local + -1][y + 1].typ = '\x05';
      lev->locations[x + 1][y + 1].typ = '\x06';
      wallification(lev,hix_local + -1,hiy_local + -1,x + 1,y + 1);
    }
  }
  return;
}

Assistant:

static void do_room_or_subroom(struct level *lev,
			       struct mkroom *croom,
			       int lowx, int lowy,
			       int hix, int hiy,
			       boolean lit,
			       schar rtype,
			       boolean special,
			       boolean is_room)
{
	int x, y;
	struct rm *loc;

	/* locations might bump level edges in wall-less rooms */
	/* add/subtract 1 to allow for edge locations */
	if (!lowx) lowx++;
	if (!lowy) lowy++;
	if (hix >= COLNO-1) hix = COLNO-2;
	if (hiy >= ROWNO-1) hiy = ROWNO-2;

	if (lit) {
		for (x = lowx-1; x <= hix+1; x++) {
			loc = &lev->locations[x][max(lowy-1,0)];
			for (y = lowy-1; y <= hiy+1; y++)
				loc++->lit = 1;
		}
		croom->rlit = 1;
	} else
		croom->rlit = 0;

	croom->lx = lowx;
	croom->hx = hix;
	croom->ly = lowy;
	croom->hy = hiy;
	croom->rtype = rtype;
	croom->doorct = 0;
	/* if we're not making a vault, lev->doorindex will still be 0
	 * if we are, we'll have problems adding niches to the previous room
	 * unless fdoor is at least doorindex
	 */
	croom->fdoor = lev->doorindex;
	croom->irregular = FALSE;

	croom->nsubrooms = 0;
	croom->sbrooms[0] = NULL;
	if (!special) {
	    for (x = lowx-1; x <= hix+1; x++)
		for (y = lowy-1; y <= hiy+1; y += (hiy-lowy+2)) {
		    lev->locations[x][y].typ = HWALL;
		    lev->locations[x][y].horizontal = 1;	/* For open/secret doors. */
		}
	    for (x = lowx-1; x <= hix+1; x += (hix-lowx+2))
		for (y = lowy; y <= hiy; y++) {
		    lev->locations[x][y].typ = VWALL;
		    lev->locations[x][y].horizontal = 0;	/* For open/secret doors. */
		}
	    for (x = lowx; x <= hix; x++) {
		loc = &lev->locations[x][lowy];
		for (y = lowy; y <= hiy; y++)
		    loc++->typ = ROOM;
	    }
	    if (is_room) {
		lev->locations[lowx-1][lowy-1].typ = TLCORNER;
		lev->locations[hix+1][lowy-1].typ = TRCORNER;
		lev->locations[lowx-1][hiy+1].typ = BLCORNER;
		lev->locations[hix+1][hiy+1].typ = BRCORNER;
		wallification(lev, lowx-1, lowy-1, hix+1, hiy+1);
	    } else {	/* a subroom */
		wallification(lev, lowx, lowy, hix, hiy);	/* this is bugs */
	    }
	}
}